

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

void __thiscall MarkdownHighlighter::iniHighlighter(MarkdownHighlighter *this,QString *text)

{
  char16_t cVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QTextFormat *pQVar6;
  CaseSensitivity CVar7;
  CaseSensitivity CVar8;
  QChar QVar9;
  int iVar11;
  QColor local_50;
  QTextCharFormat format;
  UnderlineStyle UVar10;
  
  lVar2 = (text->d).size;
  if (lVar2 != 0) {
    for (CVar8 = CaseInsensitive; (int)CVar8 < lVar2; CVar8 = CVar8 + CaseSensitive) {
      cVar1 = (text->d).ptr[(int)CVar8];
      iVar11 = (int)lVar2;
      QVar9.ucs = (char16_t)text;
      UVar10 = (UnderlineStyle)&format.super_QTextFormat;
      iVar5 = (int)this;
      if (cVar1 == L'[') {
        local_50.cspec = 0x3eb;
        pQVar6 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                            (&_formats,(HighlighterState *)&local_50)->super_QTextFormat;
        QTextFormat::QTextFormat(&format.super_QTextFormat,pQVar6);
        iVar4 = QString::indexOf(QVar9,0x5d,CVar8);
        if (iVar4 == -1) {
          QTextCharFormat::setUnderlineStyle(UVar10);
          QColor::QColor(&local_50,red);
          QTextCharFormat::setUnderlineColor((QTextCharFormat *)&format.super_QTextFormat,&local_50)
          ;
          iVar4 = iVar11;
        }
        CVar7 = iVar4 + CaseSensitive;
        QSyntaxHighlighter::setFormat(iVar5,CVar8,(QTextCharFormat *)(ulong)(CVar7 - CVar8));
LAB_001206ca:
        QTextFormat::~QTextFormat(&format.super_QTextFormat);
        CVar8 = CVar7;
        if (lVar2 <= (int)CVar7) {
          return;
        }
      }
      else {
        if (cVar1 == L';') {
          format.super_QTextFormat = (QTextFormat)0xea;
          format._1_3_ = 3;
          QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                    (&_formats,(HighlighterState *)&format);
          QSyntaxHighlighter::setFormat(iVar5,CVar8,(QTextCharFormat *)(ulong)(iVar11 - CVar8));
          return;
        }
        bVar3 = QChar::isLetter((uint)(ushort)cVar1);
        if (bVar3) {
          local_50.cspec = 1000;
          pQVar6 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                              (&_formats,(HighlighterState *)&local_50)->super_QTextFormat;
          QTextFormat::QTextFormat(&format.super_QTextFormat,pQVar6);
          iVar4 = QString::indexOf(QVar9,0x3d,CVar8);
          if (iVar4 == -1) {
            QColor::QColor(&local_50,red);
            QTextCharFormat::setUnderlineColor
                      ((QTextCharFormat *)&format.super_QTextFormat,&local_50);
            QTextCharFormat::setUnderlineStyle(UVar10);
            iVar4 = iVar11;
          }
          QSyntaxHighlighter::setFormat(iVar5,CVar8,(QTextCharFormat *)(ulong)(iVar4 - CVar8));
          CVar7 = iVar4 - CaseSensitive;
          goto LAB_001206ca;
        }
        if ((uint)(ushort)cVar1 == L'=') {
          iVar5 = QString::indexOf(QVar9,0x3b,CVar8);
          if (iVar5 == -1) {
            return;
          }
          CVar8 = iVar5 - CaseSensitive;
        }
      }
    }
  }
  return;
}

Assistant:

void MarkdownHighlighter::iniHighlighter(const QString &text) {
    if (text.isEmpty()) return;
    const auto textLen = text.length();

    for (int i = 0; i < textLen; ++i) {
        // start of a [section]
        if (text.at(i) == QChar('[')) {
            QTextCharFormat sectionFormat = _formats[CodeType];
            int sectionEnd = text.indexOf(QChar(']'), i);
            // if an end bracket isn't found, we apply red underline to show
            // error
            if (sectionEnd == -1) {
                sectionFormat.setUnderlineStyle(QTextCharFormat::DotLine);
                sectionFormat.setUnderlineColor(Qt::red);
                sectionEnd = textLen;
            }
            sectionEnd++;
            setFormat(i, sectionEnd - i, sectionFormat);
            i = sectionEnd;
            if (i >= textLen) break;
        }

        // comment ';'
        else if (text.at(i) == QChar(';')) {
            setFormat(i, textLen - i, _formats[CodeComment]);
            i = textLen;
            break;
        }

        // key-val
        else if (text.at(i).isLetter()) {
            QTextCharFormat format = _formats[CodeKeyWord];
            int equalsPos = text.indexOf(QChar('='), i);
            if (equalsPos == -1) {
                format.setUnderlineColor(Qt::red);
                format.setUnderlineStyle(QTextCharFormat::DotLine);
                equalsPos = textLen;
            }
            setFormat(i, equalsPos - i, format);
            i = equalsPos - 1;
            if (i >= textLen) break;
        }
        // skip everything after '=' (except comment)
        else if (text.at(i) == QChar('=')) {
            const int findComment = text.indexOf(QChar(';'), i);
            if (findComment == -1) break;
            i = findComment - 1;
        }
    }
}